

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

long openjtalk_getCharCode(char *text)

{
  char *p;
  int count;
  long res;
  char *text_local;
  long local_8;
  
  if (text == (char *)0x0) {
    local_8 = 0xc;
  }
  else {
    res = 0;
    count = 0;
    for (p = text; *p != '\0'; p = p + 1) {
      res = (ulong)(byte)*p + res * 0x100;
      count = count + 1;
      if (count == 4) break;
    }
    local_8 = res;
  }
  return local_8;
}

Assistant:

OPENJTALK_DLL_API long OPENJTALK_CONVENTION openjtalk_getCharCode(char *text)
{
	if (!text)
	{
		return OPENJTALKERROR_BUFFER_IS_NULL;
	}
	long res = 0;
	int count = 0;
	for (char *p = text; *p != '\0'; p++)
	{
		res <<= sizeof(char) * 8;
		res += ((long)*p) & 0xff;
		if (++count == 4)
		{
			break;
		}
	}
	return (long)res;
}